

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharacterUTF16(ImGuiIO *this,ImWchar16 c)

{
  ushort in_SI;
  unsigned_short *in_RDI;
  ImWchar cp;
  undefined2 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff2;
  ushort uVar1;
  undefined2 in_stack_fffffffffffffff4;
  ushort uVar2;
  
  if ((in_SI != 0) || (in_RDI[0xaa6] != 0)) {
    if ((in_SI & 0xfc00) == 0xd800) {
      if (in_RDI[0xaa6] != 0) {
        ImVector<unsigned_short>::push_back
                  ((ImVector<unsigned_short> *)
                   CONCAT26(in_SI,CONCAT24(0xfffd,CONCAT22(in_stack_fffffffffffffff2,
                                                           in_stack_fffffffffffffff0))),in_RDI);
      }
      in_RDI[0xaa6] = in_SI;
    }
    else {
      uVar1 = in_SI;
      if (in_RDI[0xaa6] != 0) {
        if ((in_SI & 0xfc00) == 0xdc00) {
          uVar1 = 0xfffd;
        }
        else {
          in_stack_fffffffffffffff0 = 0xfffd;
          uVar2 = in_SI;
          ImVector<unsigned_short>::push_back
                    ((ImVector<unsigned_short> *)
                     CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,CONCAT22(in_SI,0xfffd))),
                     in_RDI);
          uVar1 = in_SI;
          in_SI = uVar2;
        }
        in_RDI[0xaa6] = 0;
      }
      ImVector<unsigned_short>::push_back
                ((ImVector<unsigned_short> *)
                 CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,
                                         CONCAT22(uVar1,in_stack_fffffffffffffff0))),in_RDI);
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacterUTF16(ImWchar16 c)
{
    if (c == 0 && InputQueueSurrogate == 0)
        return;

    if ((c & 0xFC00) == 0xD800) // High surrogate, must save
    {
        if (InputQueueSurrogate != 0)
            InputQueueCharacters.push_back(IM_UNICODE_CODEPOINT_INVALID);
        InputQueueSurrogate = c;
        return;
    }

    ImWchar cp = c;
    if (InputQueueSurrogate != 0)
    {
        if ((c & 0xFC00) != 0xDC00) // Invalid low surrogate
            InputQueueCharacters.push_back(IM_UNICODE_CODEPOINT_INVALID);
        else if (IM_UNICODE_CODEPOINT_MAX == (0xFFFF)) // Codepoint will not fit in ImWchar (extra parenthesis around 0xFFFF somehow fixes -Wunreachable-code with Clang)
            cp = IM_UNICODE_CODEPOINT_INVALID;
        else
            cp = (ImWchar)(((InputQueueSurrogate - 0xD800) << 10) + (c - 0xDC00) + 0x10000);
        InputQueueSurrogate = 0;
    }
    InputQueueCharacters.push_back(cp);
}